

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson_encoder.hpp
# Opt level: O3

bool __thiscall
jsoncons::bson::
basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>
::visit_string(basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>
               *this,string_view_type *sv,semantic_tag tag,ser_context *param_3,error_code *ec)

{
  pointer *ppuVar1;
  ulong uVar2;
  iterator iVar3;
  pointer puVar4;
  pointer puVar5;
  ulong __n;
  error_code *__s;
  size_t sVar6;
  char *pcVar7;
  void *pvVar8;
  ulong uVar9;
  ulong uVar10;
  uint8_t code;
  size_t length;
  long lVar11;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *pvVar12;
  bson_errc __e;
  error_code *peVar13;
  ulong uVar14;
  long lVar15;
  difference_type __offset;
  long lVar16;
  size_t sVar17;
  ulong uVar18;
  type tVar19;
  decimal128_from_chars_result dVar20;
  value_type_conflict b;
  oid_t oid;
  uchar local_59;
  decimal128_t local_58;
  error_code *local_48;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_40;
  pointer local_38;
  
  if ((this->stack_).
      super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_start ==
      (this->stack_).
      super__Vector_base<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item,_std::allocator<jsoncons::bson::basic_bson_encoder<jsoncons::bytes_sink<std::vector<char,_std::allocator<char>_>,_void>,_std::allocator<char>_>::stack_item>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    __e = expected_bson_document;
    goto LAB_0022c271;
  }
  if (tag < regex) {
    if (tag == float128) {
      before_value(this,'\x13');
      local_58.low = 0;
      local_58.high = 0;
      dVar20 = decimal128_from_chars(sv->_M_str,sv->_M_str + sv->_M_len,&local_58);
      if (dVar20.ec == 0) {
        binary::
        native_to_little<unsigned_long,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
                  (local_58.low,
                   (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )&this->buffer_);
        binary::
        native_to_little<unsigned_long,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>,jsoncons::detail::endian>
                  (local_58.high,
                   (back_insert_iterator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                    )&this->buffer_);
        return true;
      }
      __e = invalid_decimal128_string;
      goto LAB_0022c271;
    }
    if (tag == id) {
      before_value(this,'\a');
      oid_t::oid_t((oid_t *)&local_58,sv);
      lVar15 = 0;
      do {
        local_59 = *(uchar *)((long)&local_58.low + lVar15);
        iVar3._M_current =
             (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_finish;
        if (iVar3._M_current ==
            (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
            _M_impl.super__Vector_impl_data._M_end_of_storage) {
          std::vector<unsigned_char,std::allocator<unsigned_char>>::
          _M_realloc_insert<unsigned_char_const&>
                    ((vector<unsigned_char,std::allocator<unsigned_char>> *)&this->buffer_,iVar3,
                     &local_59);
        }
        else {
          *iVar3._M_current = local_59;
          ppuVar1 = &(this->buffer_).
                     super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          *ppuVar1 = *ppuVar1 + 1;
        }
        lVar15 = lVar15 + 1;
      } while (lVar15 != 0xc);
      return true;
    }
LAB_0022c06a:
    code = '\x02';
  }
  else {
    if (tag == regex) {
      before_value(this,'\v');
      __n = sv->_M_len;
      if (__n != 0) {
        __s = (error_code *)sv->_M_str;
        pvVar8 = memchr(__s,0x2f,__n);
        lVar11 = 0;
        uVar9 = -(ulong)(pvVar8 == (void *)0x0) | (long)pvVar8 - (long)__s;
        lVar15 = 1;
        lVar16 = -1;
        peVar13 = __s;
        do {
          peVar13 = (error_code *)((long)&peVar13[-1]._M_cat + 7);
          if (__n + lVar11 == 0) goto LAB_0022c269;
          lVar15 = lVar15 + 1;
          lVar16 = lVar16 + 1;
          lVar11 = lVar11 + -1;
        } while (*(char *)((long)&peVar13->_M_value + __n) != '/');
        if ((uVar9 != 0xffffffffffffffff) && ((__n - uVar9) + lVar11 != 0)) {
          uVar2 = uVar9 + 1;
          uVar10 = __n;
          uVar18 = uVar2;
          if (uVar9 < __n) {
            uVar10 = __n - lVar15;
            uVar18 = __n - lVar16;
            uVar14 = __n - uVar2;
            uVar9 = uVar10;
            if (uVar14 < uVar10) {
              uVar9 = uVar14;
            }
            local_48 = __s;
            if (uVar9 != 0) {
              local_48 = (error_code *)((long)&__s->_M_value + uVar2);
              local_40 = &this->buffer_;
              local_38 = (pointer)uVar14;
              if (uVar10 < uVar14) {
                local_38 = (pointer)uVar10;
              }
              uVar9 = 0;
              do {
                local_58.low = CONCAT71(local_58.low._1_7_,
                                        *(char *)((long)&local_48->_M_value + uVar9));
                std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                emplace_back<unsigned_char>(local_40,(uchar *)&local_58);
                uVar9 = uVar9 + 1;
              } while (local_38 != (pointer)uVar9);
            }
            pvVar12 = &this->buffer_;
            local_58.low = local_58.low & 0xffffffffffffff00;
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                      (pvVar12,(uchar *)&local_58);
            uVar10 = sv->_M_len;
            if (uVar18 <= uVar10) {
              if (__n - uVar10 != lVar16) {
                pcVar7 = sv->_M_str;
                do {
                  local_58.low = CONCAT71(local_58.low._1_7_,pcVar7[uVar18]);
                  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
                  emplace_back<unsigned_char>(pvVar12,(uchar *)&local_58);
                  uVar18 = uVar18 + 1;
                } while (uVar10 != uVar18);
              }
              local_58.low = local_58.low & 0xffffffffffffff00;
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::
              emplace_back<unsigned_char>(pvVar12,(uchar *)&local_58);
              return true;
            }
          }
          std::__throw_out_of_range_fmt
                    ("%s: __pos (which is %zu) > __size (which is %zu)","basic_string_view::substr",
                     uVar18,uVar10);
        }
      }
LAB_0022c269:
      __e = invalid_regex_string;
      goto LAB_0022c271;
    }
    code = '\r';
    if (tag != code) goto LAB_0022c06a;
  }
  local_48 = ec;
  before_value(this,code);
  pvVar12 = &this->buffer_;
  iVar3._M_current =
       (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
       super__Vector_impl_data._M_finish;
  lVar15 = (long)iVar3._M_current -
           (long)(this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                 _M_impl.super__Vector_impl_data._M_start;
  local_58.low = local_58.low & 0xffffffffffffff00;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::_M_fill_insert
            (pvVar12,iVar3,4,(value_type_conflict *)&local_58);
  puVar4 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_start;
  puVar5 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
           .super__Vector_impl_data._M_finish;
  tVar19 = unicode_traits::validate<char>((unicode_traits *)sv->_M_str,(char *)sv->_M_len,length);
  if (tVar19.ec == success) {
    sVar6 = sv->_M_len;
    local_48 = (error_code *)lVar15;
    local_40 = (vector<unsigned_char,_std::allocator<unsigned_char>_> *)puVar5;
    local_38 = puVar4;
    if (sVar6 != 0) {
      pcVar7 = sv->_M_str;
      sVar17 = 0;
      do {
        local_58.low = CONCAT71(local_58.low._1_7_,pcVar7[sVar17]);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
                  (pvVar12,(uchar *)&local_58);
        sVar17 = sVar17 + 1;
      } while (sVar6 != sVar17);
    }
    local_58.low = local_58.low & 0xffffffffffffff00;
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::emplace_back<unsigned_char>
              (pvVar12,(uchar *)&local_58);
    puVar4 = (this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
             _M_impl.super__Vector_impl_data._M_start;
    *(int *)(puVar4 + (long)local_48) =
         ((int)local_38 +
         *(int *)&(this->buffer_).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                  _M_impl.super__Vector_impl_data._M_finish) - ((int)local_40 + (int)puVar4);
    return true;
  }
  __e = invalid_utf8_text_string;
  ec = local_48;
LAB_0022c271:
  std::error_code::operator=(ec,__e);
  return true;
}

Assistant:

JSONCONS_VISITOR_RETURN_TYPE visit_string(const string_view_type& sv, semantic_tag tag, const ser_context&, std::error_code& ec) override
    {
        if (stack_.empty())
        {
            ec = bson_errc::expected_bson_document;
            JSONCONS_VISITOR_RETURN;
        }

        switch (tag)
        {
            case semantic_tag::float128:
            {
                before_value(jsoncons::bson::bson_type::decimal128_type);
                decimal128_t dec;
                auto rc = decimal128_from_chars(sv.data(), sv.data()+sv.size(), dec);
                if (rc.ec != std::errc())
                {
                    ec = bson_errc::invalid_decimal128_string;
                    JSONCONS_VISITOR_RETURN;
                }
                binary::native_to_little(dec.low,std::back_inserter(buffer_));
                binary::native_to_little(dec.high,std::back_inserter(buffer_));
                break;
            }
            case semantic_tag::id:
            {
                before_value(jsoncons::bson::bson_type::object_id_type);
                oid_t oid(sv);
                for (auto b : oid)
                {
                    buffer_.push_back(b);
                }
                break;
            }
            case semantic_tag::regex:
            {
                before_value(jsoncons::bson::bson_type::regex_type);
                std::size_t first = sv.find_first_of('/');
                std::size_t last = sv.find_last_of('/');
                if (first == string_view::npos || last == string_view::npos || first == last)
                {
                    ec = bson_errc::invalid_regex_string;
                    JSONCONS_VISITOR_RETURN;
                }
                string_view regex = sv.substr(first+1,last-1);
                for (auto c : regex)
                {
                    buffer_.push_back(c);
                }
                buffer_.push_back(0x00);
                string_view options = sv.substr(last+1);
                for (auto c : options)
                {
                    buffer_.push_back(c);
                }
                buffer_.push_back(0x00);
                break;
            }
            default:
                switch (tag)
                {
                    case semantic_tag::code:
                        before_value(jsoncons::bson::bson_type::javascript_type);
                        break;
                    default:
                        before_value(jsoncons::bson::bson_type::string_type);
                        break;
                }
                std::size_t offset = buffer_.size();
                buffer_.insert(buffer_.end(), sizeof(int32_t), 0);
                std::size_t string_offset = buffer_.size();
                auto sink = unicode_traits::validate(sv.data(), sv.size());
                if (sink.ec != unicode_traits::conv_errc())
                {
                    ec = bson_errc::invalid_utf8_text_string;
                    JSONCONS_VISITOR_RETURN;
                }
                for (auto c : sv)
                {
                    buffer_.push_back(c);
                }
                buffer_.push_back(0x00);
                std::size_t length = buffer_.size() - string_offset;
                binary::native_to_little(static_cast<uint32_t>(length), buffer_.begin()+offset);
                break;
        }

        JSONCONS_VISITOR_RETURN;
    }